

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

uint ssh2_alloc_sharing_channel(ConnectionLayer *cl,ssh_sharing_connstate *connstate)

{
  ssh2_channel *c_00;
  ssh2_channel *c;
  ssh2_connection_state *s;
  ssh_sharing_connstate *connstate_local;
  ConnectionLayer *cl_local;
  
  c_00 = (ssh2_channel *)safemalloc(1,0xc0,0);
  c_00->connlayer = (ssh2_connection_state *)&cl[-0xe].vt;
  ssh2_channel_init(c_00);
  c_00->chan = (Channel *)0x0;
  c_00->sharectx = connstate;
  return c_00->localid;
}

Assistant:

static unsigned ssh2_alloc_sharing_channel(
    ConnectionLayer *cl, ssh_sharing_connstate *connstate)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    struct ssh2_channel *c = snew(struct ssh2_channel);

    c->connlayer = s;
    ssh2_channel_init(c);
    c->chan = NULL;
    c->sharectx = connstate;
    return c->localid;
}